

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow_p.h
# Opt level: O0

void __thiscall QMdiSubWindowPrivate::setNewGeometry(QMdiSubWindowPrivate *this,QRect *geometry)

{
  QRect *this_00;
  QSize r;
  QRect *in_RSI;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindow *q;
  QRect *in_stack_ffffffffffffffb8;
  QRect *this_01;
  QWidget *this_02;
  
  this_02 = *(QWidget **)(in_FS_OFFSET + 0x28);
  this_00 = (QRect *)q_func(in_RDI);
  this_01 = in_RSI;
  QRect::size(this_00);
  r = QSize::expandedTo((QSize *)in_RDI,(QSize *)in_RSI);
  QRect::setSize(this_01,(QSize *)this_00);
  if ((in_RDI->isInRubberBandMode & 1U) == 0) {
    QWidget::setGeometry(this_02,(QRect *)r);
  }
  else {
    QRubberBand::setGeometry((QRubberBand *)in_RSI,in_stack_ffffffffffffffb8);
  }
  if (*(QWidget **)(in_FS_OFFSET + 0x28) == this_02) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void setNewGeometry(QRect *geometry)
    {
        Q_Q(QMdiSubWindow);
        Q_ASSERT(parent);
        geometry->setSize(geometry->size().expandedTo(internalMinimumSize));
#if QT_CONFIG(rubberband)
        if (isInRubberBandMode)
            rubberBand->setGeometry(*geometry);
        else
#endif
            q->setGeometry(*geometry);
    }